

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

string * __thiscall gtar::Record::getName_abi_cxx11_(string *__return_storage_ptr__,Record *this)

{
  Record *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_name);
  return __return_storage_ptr__;
}

Assistant:

string Record::getName() const
    {
        return m_name;
    }